

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_1::AllFeaturesGroup::init
          (AllFeaturesGroup *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  ulong extraout_RAX;
  RandomShaderCase *pRVar1;
  ulong uVar2;
  deUint32 local_9c;
  int seed;
  TestCaseGroup *fragmentGroup;
  TestCaseGroup *vertexGroup;
  ProgramParameters params;
  AllFeaturesGroup *this_local;
  
  params._96_8_ = this;
  rsg::ProgramParameters::ProgramParameters((ProgramParameters *)&vertexGroup);
  params.fragmentParameters.maxSamplers._1_1_ = 1;
  params.fragmentParameters.maxSamplers._2_1_ = 1;
  params.fragmentParameters.maxSamplers._3_1_ = 1;
  params.fragmentParameters.useTexture2D = true;
  params.declarationStatementBaseWeight = false;
  params.useScalarConversions = false;
  params.useSwizzle = true;
  params.useComparisonOps = true;
  params.useConditionals = false;
  params._93_3_ = 0x3f8000;
  params.version = 4;
  params.vertexParameters.randomize = true;
  params.vertexParameters._1_3_ = 0;
  params.vertexParameters.maxStatementDepth = 7;
  params.vertexParameters.maxStatementsPerBlock = 0x40;
  params.vertexParameters.useTexture2D = true;
  params.vertexParameters.useTextureCube = false;
  params.vertexParameters._38_2_ = 0;
  params.fragmentParameters.randomize = true;
  params.fragmentParameters._1_3_ = 0;
  params.fragmentParameters.maxStatementDepth = 7;
  params.fragmentParameters.maxStatementsPerBlock = 0x40;
  params.fragmentParameters.maxUniformScalars = 0x40800000;
  params.fragmentParameters.texLookupBaseWeight._0_1_ = 1;
  params.fragmentParameters.texLookupBaseWeight._1_1_ = 1;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  local_9c = 0;
  uVar2 = extraout_RAX;
  while ((int)local_9c < 100) {
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Texture lookups in vertex shader",
                        (ProgramParameters *)&vertexGroup,local_9c,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar1);
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Texture lookups in fragment shader",
                        (ProgramParameters *)&vertexGroup,local_9c,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar1);
    local_9c = local_9c + 1;
    uVar2 = (ulong)local_9c;
  }
  return (int)uVar2;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;
		params.useScalarConversions		= true;
		params.useSwizzle				= true;
		params.useComparisonOps			= true;
		params.useConditionals			= true;
		params.trigonometricBaseWeight	= 1.0f;
		params.exponentialBaseWeight	= 1.0f;

		params.vertexParameters.maxStatementDepth				= 4;
		params.vertexParameters.maxStatementsPerBlock			= 7;
		params.vertexParameters.maxExpressionDepth				= 7;
		params.vertexParameters.maxCombinedVariableScalars		= 64;
		params.fragmentParameters.maxStatementDepth				= 4;
		params.fragmentParameters.maxStatementsPerBlock			= 7;
		params.fragmentParameters.maxExpressionDepth			= 7;
		params.fragmentParameters.maxCombinedVariableScalars	= 64;

		params.fragmentParameters.texLookupBaseWeight		= 4.0f; // \note Texture lookups are enabled for fragment shaders only.
		params.fragmentParameters.useTexture2D				= true;
		params.fragmentParameters.useTextureCube			= true;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		for (int seed = 0; seed < 100; seed++)
		{
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Texture lookups in vertex shader",		params, seed, true, false));
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Texture lookups in fragment shader",	params, seed, false, true));
		}
	}